

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

int anon_unknown.dwarf_7ef79c::ParseIndex
              (string *str,optional<(anonymous_namespace)::Args> *progress,ArrayIndex max)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> message_00;
  bool bVar1;
  json_error *pjVar2;
  string_view local_158;
  string_view local_148;
  string_view local_138;
  undefined1 local_128 [16];
  string_view local_118;
  iterator local_100;
  undefined8 local_f8;
  undefined1 local_f0 [8];
  cmAlphaNum sizeStr;
  ArrayIndex index;
  string_view local_68;
  undefined1 local_58 [16];
  string_view local_48;
  iterator local_38;
  undefined8 local_30;
  uint local_28 [2];
  unsigned_long lindex;
  optional<(anonymous_namespace)::Args> *poStack_18;
  ArrayIndex max_local;
  optional<(anonymous_namespace)::Args> *progress_local;
  string *str_local;
  
  lindex._4_4_ = max;
  poStack_18 = progress;
  progress_local = (optional<(anonymous_namespace)::Args> *)str;
  bVar1 = cmStrToULong(str,(unsigned_long *)local_28);
  if (!bVar1) {
    pjVar2 = (json_error *)__cxa_allocate_exception(0x28);
    local_68 = (string_view)::cm::operator____s("expected an array index, got: \'",0x1f);
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)progress_local);
    local_48 = (string_view)::cm::operator____s("\'",1);
    local_38 = &local_68;
    local_30 = 3;
    message_00._M_len = 3;
    message_00._M_array = local_38;
    json_error::json_error
              (pjVar2,message_00,
               (optional<(anonymous_namespace)::Args>)
               (poStack_18->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
               _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>);
    __cxa_throw(pjVar2,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  if (lindex._4_4_ <= local_28[0]) {
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_f0,lindex._4_4_);
    pjVar2 = (json_error *)__cxa_allocate_exception(0x28);
    local_158 = (string_view)::cm::operator____s("expected an index less than ",0x1c);
    local_148 = cmAlphaNum::View((cmAlphaNum *)local_f0);
    local_138 = (string_view)::cm::operator____s(" got \'",6);
    local_128 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)progress_local);
    local_118 = (string_view)::cm::operator____s("\'",1);
    local_100 = &local_158;
    local_f8 = 5;
    message._M_len = 5;
    message._M_array = local_100;
    json_error::json_error
              (pjVar2,message,
               (optional<(anonymous_namespace)::Args>)
               (poStack_18->super__Optional_base<(anonymous_namespace)::Args,_true,_true>).
               _M_payload.super__Optional_payload_base<(anonymous_namespace)::Args>);
    __cxa_throw(pjVar2,&(anonymous_namespace)::json_error::typeinfo,json_error::~json_error);
  }
  return local_28[0];
}

Assistant:

int ParseIndex(
  const std::string& str, cm::optional<Args> const& progress = cm::nullopt,
  Json::ArrayIndex max = std::numeric_limits<Json::ArrayIndex>::max())
{
  unsigned long lindex;
  if (!cmStrToULong(str, &lindex)) {
    throw json_error({ "expected an array index, got: '"_s, str, "'"_s },
                     progress);
  }
  Json::ArrayIndex index = static_cast<Json::ArrayIndex>(lindex);
  if (index >= max) {
    cmAlphaNum sizeStr{ max };
    throw json_error({ "expected an index less than "_s, sizeStr.View(),
                       " got '"_s, str, "'"_s },
                     progress);
  }
  return index;
}